

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::Generator::CreateObjectsCylinderZ
          (Generator *this,Sampler<double> *sampler,ChVector<double> *pos,float radius,
          float halfHeight,ChVector<double> *vel)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 in_XMM0_Db;
  double dVar3;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  PointVector points;
  PointVector local_60;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  float local_38;
  
  local_48 = radius;
  uStack_44 = in_XMM0_Db;
  uStack_40 = in_XMM0_Dc;
  uStack_3c = in_XMM0_Dd;
  local_38 = halfHeight;
  normalizeMixture(this);
  (*sampler->_vptr_Sampler[2])(sampler);
  iVar2 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar2 == 1) {
    dVar3 = calcMinSeparation(this,(double)CONCAT44(in_XMM0_Db,radius));
  }
  else {
    dVar3 = (double)CONCAT44(in_XMM0_Db,radius);
  }
  (*sampler->_vptr_Sampler[3])(dVar3,sampler);
  auVar1._4_4_ = uStack_44;
  auVar1._0_4_ = local_48;
  auVar1._8_4_ = uStack_40;
  auVar1._12_4_ = uStack_3c;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_38),0x10);
  auVar1 = vcvtps2pd_avx(auVar1);
  if (&sampler->m_center != pos) {
    (sampler->m_center).m_data[0] = pos->m_data[0];
    (sampler->m_center).m_data[1] = pos->m_data[1];
    (sampler->m_center).m_data[2] = pos->m_data[2];
  }
  dVar3 = (double)vmovlps_avx(auVar1);
  (sampler->m_size).m_data[0] = dVar3;
  *(undefined1 (*) [16])((sampler->m_size).m_data + 1) = auVar1;
  (*sampler->_vptr_Sampler[4])(&local_60,sampler,4);
  createObjects(this,&local_60,vel);
  if (local_60.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::CreateObjectsCylinderZ(Sampler<double>& sampler,
                                       const ChVector<>& pos,
                                       float radius,
                                       float halfHeight,
                                       const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // Generate the object locations
    double sep = sampler.GetSeparation();
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        sep = calcMinSeparation(sep);
    sampler.SetSeparation(sep);

    PointVector points = sampler.SampleCylinderZ(pos, radius, halfHeight);
    createObjects(points, vel);
}